

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_message_create
          (sysbvm_context_t *context,sysbvm_tuple_t selector,sysbvm_tuple_t arguments,
          sysbvm_tuple_t lookupType,sysbvm_tuple_t sourcePosition)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_message_t *result;
  sysbvm_tuple_t sourcePosition_local;
  sysbvm_tuple_t lookupType_local;
  sysbvm_tuple_t arguments_local;
  sysbvm_tuple_t selector_local;
  sysbvm_context_t *context_local;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).messageType,4);
  (psVar1->field_1).pointers[0] = selector;
  psVar1[1].header.field_0.typePointer = arguments;
  psVar1[1].header.identityHashAndFlags = (int)lookupType;
  psVar1[1].header.objectSize = (int)(lookupType >> 0x20);
  psVar1[1].field_1.pointers[0] = sourcePosition;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_message_create(sysbvm_context_t *context, sysbvm_tuple_t selector, sysbvm_tuple_t arguments, sysbvm_tuple_t lookupType, sysbvm_tuple_t sourcePosition)
{
    sysbvm_message_t *result = (sysbvm_message_t*)sysbvm_context_allocatePointerTuple(context, context->roots.messageType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_message_t));
    result->selector = selector;
    result->arguments = arguments;
    result->lookupType = lookupType;
    result->sourcePosition = sourcePosition;
    return (sysbvm_tuple_t)result;
}